

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmShiftIm<(moira::Instr)95,(moira::Mode)11,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  Syntax SVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  
  uVar5 = op >> 9 & 7;
  s = &str->ptr;
  cVar7 = 'r';
  lVar4 = 1;
  do {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = cVar7;
    cVar7 = "Address error"[lVar4 + 10];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  uVar3 = 8;
  if ((short)uVar5 != 0) {
    uVar3 = uVar5;
  }
  pcVar6 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar6 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar6 = '.';
    pcVar6 = *s;
    *s = pcVar6 + 1;
  }
  *pcVar6 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = ' ';
    pcVar6 = *s;
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar6 = str->ptr;
    do {
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
      pcVar6 = str->ptr;
    } while (pcVar6 < str->base + iVar2);
  }
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  sprintd(s,(ulong)uVar3);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  return;
}

Assistant:

void
Moira::dasmShiftIm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Imd ( ____xxx_________(op) );
    auto dst = Dn  ( _____________xxx(op) );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}